

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::PurgeStrings(ACSStringPool *this)

{
  uint *__s;
  byte *pbVar1;
  PoolEntry *pPVar2;
  ulong uVar3;
  FString *this_00;
  long lVar4;
  uint i;
  ulong uVar5;
  
  __s = this->PoolBuckets;
  memset(__s,0xff,0x3ec);
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (this->Pool).Count; uVar5 = uVar5 + 1) {
    pPVar2 = (this->Pool).Array;
    if (*(int *)((long)&pPVar2->Next + lVar4) != -2) {
      if (*(int *)((long)&pPVar2->LockCount + lVar4) == 0) {
        this_00 = (FString *)((long)&(pPVar2->Str).Chars + lVar4);
        *(undefined4 *)((long)&this_00[1].Chars + 4) = 0xfffffffe;
        if (uVar5 < this->FirstFreeEntry) {
          this->FirstFreeEntry = (uint)uVar5;
        }
        FString::operator=(this_00,(char *)"");
      }
      else {
        uVar3 = (ulong)*(uint *)((long)&pPVar2->Hash + lVar4) % 0xfb;
        *(uint *)((long)&pPVar2->Next + lVar4) = __s[uVar3];
        __s[uVar3] = (uint)uVar5;
        pbVar1 = (byte *)((long)&pPVar2->LockCount + lVar4 + 3);
        *pbVar1 = *pbVar1 & 0x7f;
      }
    }
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void ACSStringPool::PurgeStrings()
{
	// Clear the hash buckets. We'll rebuild them as we decide what strings
	// to keep and which to toss.
	memset(PoolBuckets, 0xFF, sizeof(PoolBuckets));
	size_t usedcount = 0, freedcount = 0;
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		PoolEntry *entry = &Pool[i];
		if (entry->Next != FREE_ENTRY)
		{
			if (entry->LockCount == 0)
			{
				freedcount++;
				// Mark this entry as free.
				entry->Next = FREE_ENTRY;
				if (i < FirstFreeEntry)
				{
					FirstFreeEntry = i;
				}
				// And free the string.
				entry->Str = "";
			}
			else
			{
				usedcount++;
				// Rehash this entry.
				unsigned int h = entry->Hash % NUM_BUCKETS;
				entry->Next = PoolBuckets[h];
				PoolBuckets[h] = i;
				// Remove MarkString's mark.
				entry->LockCount &= 0x7FFFFFFF;
			}
		}
	}
}